

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeMassMatrixAndGravityForce(ChElementHexaANCF_3843 *this)

{
  double dVar1;
  double eta;
  double zeta;
  double dVar2;
  double dVar3;
  double dVar4;
  double xi;
  Scalar SVar5;
  long lVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint j;
  long lVar13;
  uint i;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  VectorN Sxi_compact;
  ChMatrixNM<double,_NSF,_NSF> MassMatrixCompactSquare;
  double local_21e0;
  double local_21d8 [2];
  scalar_constant_op<double> local_21c8;
  RhsNested local_21c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
  local_21b0;
  __shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2> *local_2188;
  __shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2> local_2180 [16];
  DenseBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_> local_2080 [8272];
  
  Eigen::DenseBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>::setZero(local_2080);
  Eigen::DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_> *)&this->m_GravForceScale);
  std::__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_2180,
             &(this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>);
  dVar1 = (local_2180[0]._M_ptr)->m_rho;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2180[0]._M_refcount);
  lVar13 = *(long *)(DAT_011df560 + 0x48);
  lVar16 = *(long *)(DAT_011df560 + 0x50);
  lVar6 = DAT_011df560;
  for (uVar11 = 0; uVar12 = (ulong)uVar11, uVar12 < (ulong)(lVar16 - lVar13 >> 3);
      uVar11 = uVar11 + 1) {
    for (uVar14 = 0; uVar15 = (ulong)uVar14, uVar15 < (ulong)(lVar16 - lVar13 >> 3);
        uVar14 = uVar14 + 1) {
      uVar9 = 0;
      while( true ) {
        uVar10 = (ulong)uVar9;
        lVar16 = *(long *)(lVar6 + 0x50);
        lVar13 = *(long *)(lVar6 + 0x48);
        if ((ulong)(lVar16 - lVar13 >> 3) <= uVar10) break;
        eta = *(double *)(lVar13 + uVar15 * 8);
        zeta = *(double *)(lVar13 + uVar10 * 8);
        lVar16 = *(long *)(static_tables_3843 + 0x48);
        dVar2 = *(double *)(lVar16 + uVar12 * 8);
        dVar3 = *(double *)(lVar16 + uVar15 * 8);
        dVar4 = *(double *)(lVar16 + uVar10 * 8);
        xi = *(double *)(lVar13 + uVar12 * 8);
        dVar17 = Calc_det_J_0xi(this,xi,eta,zeta);
        Calc_Sxi_compact(this,(VectorN *)local_2180,xi,eta,zeta);
        dVar17 = dVar17 * dVar2 * dVar3 * dVar4 * dVar1;
        local_21d8[0] = dVar17;
        Eigen::operator*(&local_21b0,local_21d8,(StorageBaseType *)local_2180);
        Eigen::MatrixBase<Eigen::Matrix<double,32,1,0,32,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,32,1,0,32,1>> *)&this->m_GravForceScale,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>_>
                    *)&local_21b0);
        local_21e0 = dVar17;
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>
                          *)local_21d8,&local_21e0,(StorageBaseType *)local_2180);
        local_21b0.m_lhs.m_functor.m_other = local_21c8.m_other;
        local_21b0.m_rhs = local_21c0;
        local_2188 = local_2180;
        Eigen::MatrixBase<Eigen::Matrix<double,32,32,1,32,32>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,32,32,1,32,32>> *)local_2080,
                   (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_const_Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>,_0>_>
                    *)&local_21b0);
        uVar9 = uVar9 + 1;
        lVar6 = DAT_011df560;
      }
    }
  }
  uVar11 = 0;
  for (lVar16 = 0; lVar13 = lVar16, lVar16 != 0x20; lVar16 = lVar16 + 1) {
    for (; lVar13 != 0x20; lVar13 = lVar13 + 1) {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>,_1> *)local_2080
                          ,lVar16,lVar13);
      SVar5 = *pSVar7;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_528,_1,_0,_528,_1>,_1> *)
                          &this->m_MassMatrix,(ulong)uVar11);
      uVar11 = uVar11 + 1;
      *pSVar8 = SVar5;
    }
  }
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeMassMatrixAndGravityForce() {
    // For this element, the mass matrix integrand is of order 7 in xi, 7 in eta, and 7 in zeta.
    // 4 GQ Points are needed in the xi, eta, and zeta directions for exact integration of the element's mass matrix,
    // even if the reference configuration is not straight. Since the major pieces of the generalized force due to
    // gravity can also be used to calculate the mass matrix, these calculations are performed at the same time.  Only
    // the matrix that scales the acceleration due to gravity is calculated at this time so that any changes to the
    // acceleration due to gravity in the system are correctly accounted for in the generalized internal force
    // calculation.

    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = 3;  // 4 Point Gauss-Quadrature;

    // Mass Matrix in its compact matrix form.  Since the mass matrix is symmetric, just the upper diagonal entries will
    // be stored.
    ChMatrixNM<double, NSF, NSF> MassMatrixCompactSquare;

    // Set these to zeros since they will be incremented as the vector/matrix is calculated
    MassMatrixCompactSquare.setZero();
    m_GravForceScale.setZero();

    double rho = GetMaterial()->Get_rho();  // Density of the material for the element

    // Sum the contribution to the mass matrix and generalized force due to gravity at the current point
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];
                double det_J_0xi = Calc_det_J_0xi(xi, eta, zeta);  // determinant of the element Jacobian (volume ratio)

                VectorN Sxi_compact;  // Vector of the Unique Normalized Shape Functions
                Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);

                m_GravForceScale += (GQ_weight * rho * det_J_0xi) * Sxi_compact;
                MassMatrixCompactSquare += (GQ_weight * rho * det_J_0xi) * Sxi_compact * Sxi_compact.transpose();
            }
        }
    }

    // Store just the unique entries in the Mass Matrix in Compact Upper Triangular Form
    // since the full Mass Matrix is both sparse and symmetric
    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            m_MassMatrix(idx) = MassMatrixCompactSquare(i, j);
            idx++;
        }
    }
}